

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hwl.hpp
# Opt level: O2

bool hwl::cmd_str(state *ps,string *psVal)

{
  bool bVar1;
  combinator *in_R8;
  long lVar2;
  combinator local_130;
  _Any_data local_110;
  code *local_100;
  code *local_f8;
  _Any_data local_f0;
  code *local_e0;
  code *local_d8;
  _Any_data local_d0;
  code *local_c0;
  code *local_b8;
  _Any_data local_b0;
  code *local_a0;
  code *local_98;
  _Function_base local_90;
  code *local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  code *local_20;
  code *local_18;
  
  local_110._M_unused._M_object = &local_90;
  local_90._M_functor._8_8_ = 0;
  local_90._M_functor._M_unused._M_object = nl;
  local_78 = std::_Function_handler<bool_(parser::state_&),_bool_(*)(parser::state_&)>::_M_invoke;
  local_90._M_manager =
       std::_Function_handler<bool_(parser::state_&),_bool_(*)(parser::state_&)>::_M_manager;
  uStack_68 = 0;
  local_70 = 0x23;
  local_58 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:593:10)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:593:10)>
             ::_M_manager;
  local_50._M_unused._M_object = &local_110;
  local_110._8_8_ = 2;
  local_f8 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:685:10)>
             ::_M_invoke;
  local_f0._M_unused._M_object = &local_50;
  local_50._8_8_ = 0;
  local_100 = std::
              _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:685:10)>
              ::_M_manager;
  local_38 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:731:10)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:731:10)>
             ::_M_manager;
  local_30 = 0;
  uStack_28 = 0;
  local_18 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:628:10)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:628:10)>
             ::_M_manager;
  local_d0._8_8_ = &local_f0;
  local_f0._8_8_ = 2;
  local_d8 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:674:10)>
             ::_M_invoke;
  local_e0 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:674:10)>
             ::_M_manager;
  local_b0._8_8_ = &local_d0;
  local_d0._M_unused._M_member_pointer = 4;
  local_b8 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:808:10)>
             ::_M_invoke;
  local_c0 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:808:10)>
             ::_M_manager;
  local_98 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:825:10)>
             ::_M_invoke;
  local_a0 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:825:10)>
             ::_M_manager;
  local_b0._M_unused._M_object = psVal;
  parser::memoize<std::__cxx11::string>
            (&local_130,(parser *)0x3,(ind)psVal,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0,in_R8);
  bVar1 = std::function<bool_(parser::state_&)>::operator()(&local_130,ps);
  std::_Function_base::~_Function_base(&local_130.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_b0);
  std::_Function_base::~_Function_base((_Function_base *)&local_d0);
  std::_Function_base::~_Function_base((_Function_base *)&local_f0);
  lVar2 = 0x20;
  do {
    std::_Function_base::~_Function_base((_Function_base *)((long)&local_50 + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  std::_Function_base::~_Function_base((_Function_base *)&local_110);
  lVar2 = 0x20;
  do {
    std::_Function_base::~_Function_base((_Function_base *)((long)&local_90._M_functor + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  return bVar1;
}

Assistant:

bool cmd_str(parser::state& ps, std::string          & psVal) {
		return parser::memoize(3, psVal, parser::capture(psVal, parser::memoize_many(4, 
			parser::sequence({
				parser::look_not(
					parser::choice({
						nl,
						parser::literal('#')})),
				parser::any()}))))(ps);
	}